

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall glslang::TSymbolTable::pop(TSymbolTable *this,TPrecisionQualifier *p)

{
  TPrecisionQualifier *pTVar1;
  uint uVar2;
  pointer ppTVar3;
  undefined1 uVar4;
  pointer ppTVar5;
  long lVar6;
  
  ppTVar5 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (this->table).
            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((p != (TPrecisionQualifier *)0x0) &&
     (pTVar1 = ppTVar5[((long)ppTVar3 - (long)ppTVar5) * 0x20000000 + -0x100000000 >> 0x20]->
               defaultPrecision, pTVar1 != (TPrecisionQualifier *)0x0)) {
    lVar6 = 0;
    do {
      p[lVar6] = pTVar1[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1c);
  }
  if (ppTVar3[-1] != (TSymbolTableLevel *)0x0) {
    TSymbolTableLevel::~TSymbolTableLevel(ppTVar3[-1]);
    ppTVar5 = (this->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar3 = (this->table).
              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->table).
  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppTVar3 + -1;
  uVar2 = (int)((ulong)((long)(ppTVar3 + -1) - (long)ppTVar5) >> 3) - 1;
  uVar4 = 0x7f;
  if (uVar2 < 0x80) {
    uVar4 = (char)uVar2;
  }
  *(undefined1 *)((long)&this->uniqueId + 7) = uVar4;
  return;
}

Assistant:

void pop(TPrecisionQualifier *p)
    {
        table[currentLevel()]->getPreviousDefaultPrecisions(p);
        delete table.back();
        table.pop_back();
        updateUniqueIdLevelFlag();
    }